

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall ByteCodeGenerator::EmitProgram(ByteCodeGenerator *this,ParseNodeProg *pnodeProg)

{
  int iVar1;
  ParseableFunctionInfo *functionInfo;
  Symbol *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int iVar6;
  Symbol *sym;
  
  this->isBinding = false;
  this->trackEnvDepth = true;
  sym = this->globalScope->m_symList;
  if (sym != (Symbol *)0x0) {
    functionInfo = ((pnodeProg->super_ParseNodeFnc).funcInfo)->byteCodeFunction;
    do {
      pSVar2 = sym->next;
      AssignPropertyId(this,sym,functionInfo);
      sym = pSVar2;
    } while (pSVar2 != (Symbol *)0x0);
  }
  iVar1 = this->maxAstSize;
  iVar6 = iVar1 + 3;
  if (-1 < iVar1) {
    iVar6 = iVar1;
  }
  Js::ByteCodeWriter::InitData(&this->m_writer,this->alloc,iVar6 >> 2);
  if ((pnodeProg == (ParseNodeProg *)0x0) ||
     ((pnodeProg->super_ParseNodeFnc).super_ParseNode.nop != knopProg)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0xa15,"(pnodeProg && pnodeProg->nop == knopProg)",
                       "pnodeProg && pnodeProg->nop == knopProg");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (this->parentScopeInfo != (ScopeInfo *)0x0) {
    pnodeProg = (ParseNodeProg *)(pnodeProg->super_ParseNodeFnc).pnodeScopes;
  }
  EmitScopeList(this,(ParseNode *)pnodeProg,(ParseNode *)0x0);
  return;
}

Assistant:

void ByteCodeGenerator::EmitProgram(ParseNodeProg *pnodeProg)
{
    // Indicate that the binding phase is over.
    this->isBinding = false;
    this->trackEnvDepth = true;
    AssignPropertyIds(pnodeProg->funcInfo->byteCodeFunction);

    int32 initSize = this->maxAstSize / AstBytecodeRatioEstimate;

    // Use the temp allocator in bytecode write temp buffer.
    m_writer.InitData(this->alloc, initSize);

#ifdef LOG_BYTECODE_AST_RATIO
    // log the max Ast size
    Output::Print(_u("Max Ast size: %d"), initSize);
#endif

    Assert(pnodeProg && pnodeProg->nop == knopProg);

    if (this->parentScopeInfo)
    {
        // Scope stack is already set up the way we want it, so don't visit the global scope.
        // Start emitting with the nested scope (i.e., the deferred function).
        this->EmitScopeList(pnodeProg->pnodeScopes);
    }
    else
    {
        this->EmitScopeList(pnodeProg);
    }
}